

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall QPDFObjectHandle::assertType(QPDFObjectHandle *this,char *type_name,bool istype)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  undefined7 in_register_00000011;
  QPDFObjectHandle local_c0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if ((int)CONCAT71(in_register_00000011,istype) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"operation for ","");
    plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
    local_70 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_70 == plVar2) {
      local_60 = *plVar2;
      lStack_58 = plVar1[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar2;
    }
    local_68 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_90 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_c0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_c0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      getTypeCode(&local_c0);
    }
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0 = (long *)*plVar1;
    plVar2 = plVar1 + 2;
    if (local_b0 == plVar2) {
      local_a0 = *plVar2;
      lStack_98 = plVar1[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar2;
    }
    local_a8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_b0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::assertType(char const* type_name, bool istype) const
{
    if (!istype) {
        throw std::runtime_error(
            std::string("operation for ") + type_name + " attempted on object of type " +
            QPDFObjectHandle(*this).getTypeName());
    }
}